

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O3

cJSON_bool print_object(cJSON *item,printbuffer *output_buffer)

{
  cJSON *item_00;
  cJSON_bool cVar1;
  uchar *puVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  size_t sVar6;
  long lVar7;
  
  cVar1 = 0;
  if (output_buffer != (printbuffer *)0x0) {
    item_00 = item->child;
    uVar5 = (ulong)(output_buffer->format == 0);
    puVar2 = ensure(output_buffer,uVar5 ^ 3);
    cVar1 = 0;
    if (puVar2 != (uchar *)0x0) {
      *puVar2 = '{';
      output_buffer->depth = output_buffer->depth + 1;
      if (output_buffer->format != 0) {
        puVar2[1] = '\n';
      }
      output_buffer->offset = output_buffer->offset + (2 - uVar5);
      for (; item_00 != (cJSON *)0x0; item_00 = item_00->next) {
        if (output_buffer->format != 0) {
          puVar2 = ensure(output_buffer,output_buffer->depth);
          if (puVar2 == (uchar *)0x0) {
            return 0;
          }
          if (output_buffer->depth == 0) {
            uVar5 = 0;
          }
          else {
            uVar4 = 0;
            do {
              puVar2[uVar4] = '\t';
              uVar4 = uVar4 + 1;
              uVar5 = output_buffer->depth;
            } while (uVar4 < uVar5);
          }
          output_buffer->offset = output_buffer->offset + uVar5;
        }
        cVar1 = print_string_ptr((uchar *)item_00->string,output_buffer);
        if (cVar1 == 0) {
          return 0;
        }
        if (output_buffer->buffer != (uchar *)0x0) {
          sVar6 = output_buffer->offset;
          sVar3 = strlen((char *)(output_buffer->buffer + sVar6));
          output_buffer->offset = sVar3 + sVar6;
        }
        sVar6 = 2 - (ulong)(output_buffer->format == 0);
        puVar2 = ensure(output_buffer,sVar6);
        if (puVar2 == (uchar *)0x0) {
          return 0;
        }
        *puVar2 = ':';
        if (output_buffer->format != 0) {
          puVar2[1] = '\t';
        }
        output_buffer->offset = output_buffer->offset + sVar6;
        cVar1 = print_value(item_00,output_buffer);
        if (cVar1 == 0) {
          return 0;
        }
        if (output_buffer->buffer != (uchar *)0x0) {
          sVar6 = output_buffer->offset;
          sVar3 = strlen((char *)(output_buffer->buffer + sVar6));
          output_buffer->offset = sVar3 + sVar6;
        }
        lVar7 = ((ulong)(item_00->next != (cJSON *)0x0) + 1) - (ulong)(output_buffer->format == 0);
        puVar2 = ensure(output_buffer,lVar7 + 1);
        if (puVar2 == (uchar *)0x0) {
          return 0;
        }
        if (item_00->next != (cJSON *)0x0) {
          *puVar2 = ',';
          puVar2 = puVar2 + 1;
        }
        if (output_buffer->format != 0) {
          *puVar2 = '\n';
          puVar2 = puVar2 + 1;
        }
        *puVar2 = '\0';
        output_buffer->offset = output_buffer->offset + lVar7;
      }
      if (output_buffer->format == 0) {
        sVar6 = 2;
      }
      else {
        sVar6 = output_buffer->depth + 1;
      }
      puVar2 = ensure(output_buffer,sVar6);
      cVar1 = 0;
      if (puVar2 != (uchar *)0x0) {
        if ((output_buffer->format != 0) && (output_buffer->depth != 1)) {
          uVar5 = 0;
          do {
            puVar2[uVar5] = '\t';
            uVar5 = uVar5 + 1;
          } while (uVar5 < output_buffer->depth - 1);
          puVar2 = puVar2 + uVar5;
        }
        puVar2[0] = '}';
        puVar2[1] = '\0';
        output_buffer->depth = output_buffer->depth - 1;
        cVar1 = 1;
      }
    }
  }
  return cVar1;
}

Assistant:

static cJSON_bool print_object(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output_pointer = NULL;
    size_t length = 0;
    cJSON *current_item = item->child;

    if (output_buffer == NULL)
    {
        return false;
    }

    /* Compose the output: */
    length = (size_t) (output_buffer->format ? 2 : 1); /* fmt: {\n */
    output_pointer = ensure(output_buffer, length + 1);
    if (output_pointer == NULL)
    {
        return false;
    }

    *output_pointer++ = '{';
    output_buffer->depth++;
    if (output_buffer->format)
    {
        *output_pointer++ = '\n';
    }
    output_buffer->offset += length;

    while (current_item)
    {
        if (output_buffer->format)
        {
            size_t i;
            output_pointer = ensure(output_buffer, output_buffer->depth);
            if (output_pointer == NULL)
            {
                return false;
            }
            for (i = 0; i < output_buffer->depth; i++)
            {
                *output_pointer++ = '\t';
            }
            output_buffer->offset += output_buffer->depth;
        }

        /* print key */
        if (!print_string_ptr((unsigned char*)current_item->string, output_buffer))
        {
            return false;
        }
        update_offset(output_buffer);

        length = (size_t) (output_buffer->format ? 2 : 1);
        output_pointer = ensure(output_buffer, length);
        if (output_pointer == NULL)
        {
            return false;
        }
        *output_pointer++ = ':';
        if (output_buffer->format)
        {
            *output_pointer++ = '\t';
        }
        output_buffer->offset += length;

        /* print value */
        if (!print_value(current_item, output_buffer))
        {
            return false;
        }
        update_offset(output_buffer);

        /* print comma if not last */
        length = ((size_t)(output_buffer->format ? 1 : 0) + (size_t)(current_item->next ? 1 : 0));
        output_pointer = ensure(output_buffer, length + 1);
        if (output_pointer == NULL)
        {
            return false;
        }
        if (current_item->next)
        {
            *output_pointer++ = ',';
        }

        if (output_buffer->format)
        {
            *output_pointer++ = '\n';
        }
        *output_pointer = '\0';
        output_buffer->offset += length;

        current_item = current_item->next;
    }

    output_pointer = ensure(output_buffer, output_buffer->format ? (output_buffer->depth + 1) : 2);
    if (output_pointer == NULL)
    {
        return false;
    }
    if (output_buffer->format)
    {
        size_t i;
        for (i = 0; i < (output_buffer->depth - 1); i++)
        {
            *output_pointer++ = '\t';
        }
    }
    *output_pointer++ = '}';
    *output_pointer = '\0';
    output_buffer->depth--;

    return true;
}